

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void canvas_iemguis(_glist *gl,t_symbol *guiobjname)

{
  _binbuf *x;
  t_symbol *sel;
  _glist *x_00;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var1;
  _glist *x_01;
  void *data;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  t_atom at;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  t_atom local_40;
  
  x = binbuf_new();
  canvas_howputnew(gl,&local_44,&local_48,&local_4c,&local_50,&local_54);
  sel = gensym("editmode");
  pd_vmess((t_pd *)gl,sel,"i",1);
  glist_noselect(gl);
  local_40.a_type = A_SYMBOL;
  local_40.a_w.w_symbol = guiobjname;
  binbuf_restore(x,1,&local_40);
  canvas_objtext(gl,local_48 / gl->gl_zoom,local_4c / gl->gl_zoom,0,1,x);
  if (local_44 == 0) {
    p_Var1 = glist_getcanvas(x_00);
    canvas_startmotion(p_Var1);
    p_Var1 = extraout_RAX_00;
  }
  else {
    canvas_connect(gl,(float)local_50,0.0,(float)local_54,0.0);
    p_Var1 = extraout_RAX;
  }
  p_Var1 = glist_getcanvas(p_Var1);
  x_01 = glist_getcanvas(p_Var1);
  data = canvas_undo_set_create(x_01);
  canvas_undo_add(p_Var1,UNDO_CREATE,"create",data);
  return;
}

Assistant:

void canvas_iemguis(t_glist *gl, t_symbol *guiobjname)
{
    t_atom at;
    t_binbuf *b = binbuf_new();

    int connectme, xpix, ypix, indx, nobj;
    canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);

    pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);

    glist_noselect(gl);
    SETSYMBOL(&at, guiobjname);
    binbuf_restore(b, 1, &at);

    canvas_objtext(gl, xpix/gl->gl_zoom, ypix/gl->gl_zoom, 0, 1, b);
    if(connectme)
        canvas_connect(gl, indx, 0, nobj, 0);
    else canvas_startmotion(glist_getcanvas(gl));
    canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
        (void *)canvas_undo_set_create(glist_getcanvas(gl)));
}